

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::DeleteStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,DeleteStatement *this)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_00;
  pointer pTVar1;
  const_reference this_01;
  pointer pPVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  idx_t i;
  ulong uVar4;
  allocator local_b1;
  string column;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CommonTableExpressionMap::ToString_abi_cxx11_(&column,&this->cte_map);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&column);
  ::std::__cxx11::string::~string((string *)&column);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pTVar1 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     (&this->table);
  (*pTVar1->_vptr_TableRef[2])(&column,pTVar1);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&column);
  if ((this->using_clauses).
      super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->using_clauses).
      super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->using_clauses).
                              super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->using_clauses).
                              super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      this_01 = vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_true>
                ::get<true>(&this->using_clauses,uVar4);
      pTVar1 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                         (this_01);
      (*pTVar1->_vptr_TableRef[2])(&column,pTVar1);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&column);
    }
  }
  if ((this->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->condition);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pPVar2);
    ::std::operator+(&column," WHERE ",&local_90);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&column);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  if ((this->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    this_00 = &this->returning_list;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->returning_list).
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->returning_list).
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pvVar3 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(this_00,uVar4);
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar3);
      (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&column,pPVar2);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(this_00,uVar4);
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar3);
      if ((pPVar2->super_BaseExpression).alias._M_string_length != 0) {
        ::std::__cxx11::string::string(local_50," AS %s",&local_b1);
        pvVar3 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::get<true>(this_00,uVar4);
        pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar3);
        params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        KeywordHelper::WriteOptionallyQuoted
                  (&local_70,&(pPVar2->super_BaseExpression).alias,'\"',true);
        StringUtil::Format<std::__cxx11::string>(&local_90,(StringUtil *)local_50,&local_70,params);
        ::std::__cxx11::string::append((string *)&column);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string(local_50);
      }
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&column);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string DeleteStatement::ToString() const {
	string result;
	result = cte_map.ToString();
	result += "DELETE FROM ";
	result += table->ToString();
	if (!using_clauses.empty()) {
		result += " USING ";
		for (idx_t i = 0; i < using_clauses.size(); i++) {
			if (i > 0) {
				result += ", ";
			}
			result += using_clauses[i]->ToString();
		}
	}
	if (condition) {
		result += " WHERE " + condition->ToString();
	}

	if (!returning_list.empty()) {
		result += " RETURNING ";
		for (idx_t i = 0; i < returning_list.size(); i++) {
			if (i > 0) {
				result += ", ";
			}
			auto column = returning_list[i]->ToString();
			if (!returning_list[i]->GetAlias().empty()) {
				column +=
				    StringUtil::Format(" AS %s", KeywordHelper::WriteOptionallyQuoted(returning_list[i]->GetAlias()));
			}
			result += column;
		}
	}
	return result;
}